

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O2

ValueLength arangodb::velocypack::getVariableValueLength(ValueLength value)

{
  ValueLength len;
  ValueLength VVar1;
  
  VVar1 = 1;
  for (; 0x7f < value; value = value >> 7) {
    VVar1 = VVar1 + 1;
  }
  return VVar1;
}

Assistant:

static inline ValueLength getVariableValueLength(ValueLength value) noexcept {
  ValueLength len = 1;
  while (value >= 0x80U) {
    value >>= 7;
    ++len;
  }
  return len;
}